

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

ATTACH_HANDLE attach_clone(ATTACH_HANDLE value)

{
  ATTACH_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (ATTACH_HANDLE)malloc(8);
  if (__ptr != (ATTACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ATTACH_HANDLE)0x0;
}

Assistant:

ATTACH_HANDLE attach_clone(ATTACH_HANDLE value)
{
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)malloc(sizeof(ATTACH_INSTANCE));
    if (attach_instance != NULL)
    {
        attach_instance->composite_value = amqpvalue_clone(((ATTACH_INSTANCE*)value)->composite_value);
        if (attach_instance->composite_value == NULL)
        {
            free(attach_instance);
            attach_instance = NULL;
        }
    }

    return attach_instance;
}